

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O3

size_t __thiscall
BlockFilterIndex::WriteFilterToDisk(BlockFilterIndex *this,FlatFilePos *pos,BlockFilter *filter)

{
  pointer puVar1;
  pointer puVar2;
  string_view source_file;
  bool bVar3;
  ulong uVar4;
  Logger *pLVar5;
  bool *out_of_space_00;
  long lVar6;
  int source_line;
  char *flag;
  size_t add_size;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool out_of_space;
  string log_msg;
  char *in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff18) [18];
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  bool local_d2 [98];
  string local_70;
  undefined1 local_50 [32];
  long local_30;
  long lVar7;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (filter->m_filter_type != this->m_filter_type) {
    __assert_fail("filter.GetFilterType() == GetFilterType()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
                  ,0xbf,
                  "size_t BlockFilterIndex::WriteFilterToDisk(FlatFilePos &, const BlockFilter &)");
  }
  puVar1 = (filter->m_filter).m_encoded.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (filter->m_filter).m_encoded.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar2 - (long)puVar1;
  lVar6 = 1;
  if ((0xfc < uVar4) && (lVar6 = 3, 0xffff < uVar4)) {
    lVar6 = (ulong)(uVar4 >> 0x20 != 0) * 4 + 5;
  }
  lVar7 = 0x20;
  if (puVar1 != puVar2) {
    lVar7 = uVar4 + 0x20;
  }
  add_size = lVar7 + lVar6;
  if (pos->nPos + add_size < 0x1000001) {
LAB_008852ad:
    out_of_space_00 = local_d2;
    FlatFileSeq::Allocate
              ((this->m_filter_fileseq)._M_t.
               super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>._M_t.
               super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>.
               super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,add_size,out_of_space_00
              );
    if (local_d2[0] != true) {
      local_50._0_8_ =
           FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                             super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>
                             .super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,false);
      local_50._8_8_ = (pointer)0x0;
      local_50._16_8_ = (pointer)0x0;
      local_50._24_8_ = (pointer)0x0;
      if ((FILE *)local_50._0_8_ == (FILE *)0x0) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
        ;
        source_file_00._M_len = 99;
        logging_function._M_str = "WriteFilterToDisk";
        logging_function._M_len = 0x11;
        LogPrintf_<char[18],int>
                  (logging_function,source_file_00,0xe3,
                   IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PROXY|REINDEX|SELECTCOINS|ADDRMAN|
                   ESTIMATEFEE|RPC|WALLETDB|BENCH|NET,(Level)pos,in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff18,
                   (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        add_size = 0;
      }
      else {
        AutoFile::write((AutoFile *)local_50,(int)filter + 1,(void *)0x20,(size_t)out_of_space_00);
        AutoFile::operator<<((AutoFile *)local_50,&(filter->m_filter).m_encoded);
      }
      AutoFile::~AutoFile((AutoFile *)local_50);
      goto LAB_008854de;
    }
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar5);
    if (bVar3) {
      local_50._8_8_ = (pointer)0x0;
      local_50._16_8_ = local_50._16_8_ & 0xffffffffffffff00;
      local_50._0_8_ = (FILE *)(local_50 + 0x10);
      tinyformat::format<char[18]>
                (&local_70,"%s: out of disk space\n",(char (*) [18])"WriteFilterToDisk");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pLVar5 = LogInstance();
      local_70._M_dataplus._M_p = (pointer)0x63;
      local_70._M_string_length = 0xf98ee8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file._M_len = 99;
      str._M_str = (char *)local_50._0_8_;
      str._M_len = local_50._8_8_;
      logging_function_01._M_str = "WriteFilterToDisk";
      logging_function_01._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function_01,source_file,0xdd,ALL,Info);
      if ((FILE *)local_50._0_8_ != (FILE *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
      }
    }
  }
  else {
    local_50._0_8_ =
         FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                           super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>.
                           super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,false);
    local_50._8_8_ = (pointer)0x0;
    local_50._16_8_ = (pointer)0x0;
    local_50._24_8_ = (pointer)0x0;
    if ((FILE *)local_50._0_8_ == (FILE *)0x0) {
      flag = "%s: Failed to open filter file %d\n";
      source_line = 0xc9;
    }
    else {
      bVar3 = TruncateFile((FILE *)local_50._0_8_,pos->nPos);
      if (bVar3) {
        bVar3 = FileCommit((FILE *)local_50._0_8_);
        if (bVar3) {
          pos->nFile = pos->nFile + 1;
          pos->nPos = 0;
          AutoFile::~AutoFile((AutoFile *)local_50);
          goto LAB_008852ad;
        }
        flag = "%s: Failed to commit filter file %d\n";
        source_line = 0xd1;
      }
      else {
        flag = "%s: Failed to truncate filter file %d\n";
        source_line = 0xcd;
      }
    }
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
    ;
    source_file_01._M_len = 99;
    logging_function_00._M_str = "WriteFilterToDisk";
    logging_function_00._M_len = 0x11;
    LogPrintf_<char[18],int>
              (logging_function_00,source_file_01,source_line,(LogFlags)flag,(Level)pos,
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
               (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    AutoFile::~AutoFile((AutoFile *)local_50);
  }
  add_size = 0;
LAB_008854de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return add_size;
  }
  __stack_chk_fail();
}

Assistant:

size_t BlockFilterIndex::WriteFilterToDisk(FlatFilePos& pos, const BlockFilter& filter)
{
    assert(filter.GetFilterType() == GetFilterType());

    size_t data_size =
        GetSerializeSize(filter.GetBlockHash()) +
        GetSerializeSize(filter.GetEncodedFilter());

    // If writing the filter would overflow the file, flush and move to the next one.
    if (pos.nPos + data_size > MAX_FLTR_FILE_SIZE) {
        AutoFile last_file{m_filter_fileseq->Open(pos)};
        if (last_file.IsNull()) {
            LogPrintf("%s: Failed to open filter file %d\n", __func__, pos.nFile);
            return 0;
        }
        if (!TruncateFile(last_file.Get(), pos.nPos)) {
            LogPrintf("%s: Failed to truncate filter file %d\n", __func__, pos.nFile);
            return 0;
        }
        if (!FileCommit(last_file.Get())) {
            LogPrintf("%s: Failed to commit filter file %d\n", __func__, pos.nFile);
            return 0;
        }

        pos.nFile++;
        pos.nPos = 0;
    }

    // Pre-allocate sufficient space for filter data.
    bool out_of_space;
    m_filter_fileseq->Allocate(pos, data_size, out_of_space);
    if (out_of_space) {
        LogPrintf("%s: out of disk space\n", __func__);
        return 0;
    }

    AutoFile fileout{m_filter_fileseq->Open(pos)};
    if (fileout.IsNull()) {
        LogPrintf("%s: Failed to open filter file %d\n", __func__, pos.nFile);
        return 0;
    }

    fileout << filter.GetBlockHash() << filter.GetEncodedFilter();
    return data_size;
}